

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O1

drwav_uint64 drwav_read_f32__pcm(drwav *pWav,drwav_uint64 samplesToRead,float *pBufferOut)

{
  ushort uVar1;
  uint uVar2;
  size_t i;
  drwav_uint64 sampleCount;
  drwav_uint64 dVar3;
  short sVar4;
  ulong uVar5;
  byte *pbVar6;
  float *pfVar7;
  ulong uVar8;
  ulong uVar9;
  drwav_uint64 dVar10;
  float fVar11;
  uchar sampleData [4096];
  byte local_1038 [4104];
  
  if (pWav->bytesPerSample == 0) {
    dVar10 = 0;
  }
  else {
    dVar10 = 0;
    do {
      if (samplesToRead == 0) {
        return dVar10;
      }
      uVar5 = (ulong)(0x1000 / pWav->bytesPerSample);
      if (samplesToRead < uVar5) {
        uVar5 = samplesToRead;
      }
      sampleCount = drwav_read(pWav,uVar5,local_1038);
      if (sampleCount != 0) {
        uVar1 = pWav->bytesPerSample;
        switch(uVar1) {
        case 1:
          if (pBufferOut != (float *)0x0) {
            dVar3 = 0;
            do {
              pBufferOut[dVar3] =
                   (float)local_1038[dVar3] / 255.0 + (float)local_1038[dVar3] / 255.0 + -1.0;
              dVar3 = dVar3 + 1;
            } while (sampleCount != dVar3);
          }
          break;
        case 2:
          if (pBufferOut != (float *)0x0) {
            dVar3 = 0;
            do {
              pBufferOut[dVar3] = (float)(int)*(short *)(local_1038 + dVar3 * 2) * 3.0517578e-05;
              dVar3 = dVar3 + 1;
            } while (sampleCount != dVar3);
          }
          break;
        case 3:
          drwav_s24_to_f32(pBufferOut,local_1038,sampleCount);
          break;
        case 4:
          if (pBufferOut != (float *)0x0) {
            dVar3 = 0;
            do {
              pBufferOut[dVar3] = (float)*(int *)(local_1038 + dVar3 * 4) * 4.656613e-10;
              dVar3 = dVar3 + 1;
            } while (sampleCount != dVar3);
          }
          break;
        default:
          if (uVar1 < 9) {
            uVar2 = (uint)uVar1;
            uVar5 = 0;
            pbVar6 = local_1038;
            pfVar7 = pBufferOut;
            do {
              if (uVar2 == 0) {
                fVar11 = 0.0;
              }
              else {
                uVar8 = 0;
                uVar9 = 0;
                sVar4 = uVar1 * -8 + 0x40;
                do {
                  uVar9 = uVar9 | (ulong)pbVar6[uVar8] << ((byte)sVar4 & 0x3f);
                  sVar4 = sVar4 + 8;
                  uVar8 = uVar8 + 1;
                } while (uVar2 != uVar8);
                fVar11 = (float)((double)(long)uVar9 * 1.0842021724855044e-19);
              }
              *pfVar7 = fVar11;
              pfVar7 = pfVar7 + 1;
              uVar5 = (ulong)((int)uVar5 + 1);
              pbVar6 = pbVar6 + uVar2;
            } while (uVar5 < sampleCount);
          }
          else {
            memset(pBufferOut,0,sampleCount * 4);
          }
        }
        pBufferOut = pBufferOut + sampleCount;
        samplesToRead = samplesToRead - sampleCount;
        dVar10 = dVar10 + sampleCount;
      }
    } while (sampleCount != 0);
  }
  return dVar10;
}

Assistant:

drwav_uint64 drwav_read_f32__pcm(drwav* pWav, drwav_uint64 samplesToRead, float* pBufferOut) {
    if (pWav->bytesPerSample == 0) {
        return 0;
    }

    drwav_uint64 totalSamplesRead = 0;
    unsigned char sampleData[4096];
    while (samplesToRead > 0) {
        drwav_uint64 samplesRead =
            drwav_read(pWav, drwav_min(samplesToRead, sizeof(sampleData) / pWav->bytesPerSample), sampleData);
        if (samplesRead == 0) {
            break;
        }

        drwav__pcm_to_f32(pBufferOut, sampleData, (size_t)samplesRead, pWav->bytesPerSample);
        pBufferOut += samplesRead;

        samplesToRead -= samplesRead;
        totalSamplesRead += samplesRead;
    }

    return totalSamplesRead;
}